

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

Vec_Wrd_t * Zyx_ManTruthTables(Zyx_Man_t *p,word *pTruth)

{
  int iVar1;
  word wVar2;
  int iVar3;
  Vec_Wrd_t *pVVar4;
  word *__s;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  word *pwVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  
  iVar10 = p->nWords;
  lVar8 = (long)iVar10;
  iVar1 = p->nObjs;
  lVar15 = ((long)iVar1 + 1) * lVar8;
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  iVar3 = (int)lVar15;
  iVar5 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar5 = iVar3;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar5 << 3);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar3;
  memset(__s,0,(long)iVar3 << 3);
  p->vInfo = pVVar4;
  uVar7 = p->pPars->nVars;
  uVar6 = p->pPars->fMajority;
  uVar9 = 1 << ((byte)uVar7 & 0x1f);
  uVar16 = 0x40;
  if (0x40 < (int)uVar9) {
    uVar16 = uVar9;
  }
  if (uVar6 != (pTruth == (word *)0x0)) {
    __assert_fail("p->pPars->fMajority == (pTruth == NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                  ,0x2f5,"Vec_Wrd_t *Zyx_ManTruthTables(Zyx_Man_t *, word *)");
  }
  if (0 < (int)uVar7) {
    uVar9 = 1 << ((byte)uVar7 - 6 & 0x1f);
    if ((int)uVar7 < 7) {
      uVar9 = 1;
    }
    uVar11 = 0;
    pwVar13 = __s;
    do {
      if (((long)(uVar11 * lVar8) < 0) || (lVar15 <= (long)(uVar11 * lVar8))) goto LAB_005ab2d1;
      if (uVar11 < 6) {
        if (0 < (int)uVar9) {
          wVar2 = s_Truths6[uVar11];
          uVar14 = 0;
          do {
            pwVar13[uVar14] = wVar2;
            uVar14 = uVar14 + 1;
          } while (uVar9 != uVar14);
        }
      }
      else if (0 < (int)uVar9) {
        uVar14 = 0;
        do {
          pwVar13[uVar14] = -(ulong)((1 << ((char)uVar11 - 6U & 0x1f) & (uint)uVar14) != 0);
          uVar14 = uVar14 + 1;
        } while (uVar9 != uVar14);
      }
      uVar11 = uVar11 + 1;
      pwVar13 = pwVar13 + lVar8;
    } while (uVar11 != uVar7);
  }
  if (uVar6 != 0) {
    uVar9 = iVar10 * iVar1;
    uVar6 = 0;
    do {
      iVar10 = 0;
      if (0 < (int)uVar7) {
        iVar10 = 0;
        uVar12 = 0;
        do {
          iVar10 = iVar10 + (uint)((uVar6 >> (uVar12 & 0x1f) & 1) != 0);
          uVar12 = uVar12 + 1;
        } while (uVar7 != uVar12);
      }
      if ((int)uVar7 / 2 < iVar10) {
        if (iVar3 <= (int)uVar9 || (int)uVar9 < 0) {
LAB_005ab2d1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        __s[(ulong)uVar9 + (ulong)(uVar6 >> 6)] =
             __s[(ulong)uVar9 + (ulong)(uVar6 >> 6)] | 1L << ((byte)uVar6 & 0x3f);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar16);
    uVar11 = 0;
    do {
      iVar10 = p->pPars->nVars / 2;
      if (Abc_TtBitCount8[uVar11 >> 8] + Abc_TtBitCount8[uVar11 & 0xff] == iVar10 + 1 ||
          Abc_TtBitCount8[uVar11 >> 8] + Abc_TtBitCount8[uVar11 & 0xff] == iVar10) {
        Vec_IntPush(p->vMidMints,(int)uVar11);
      }
      uVar7 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar7;
    } while (uVar16 != uVar7);
  }
  return pVVar4;
}

Assistant:

Vec_Wrd_t * Zyx_ManTruthTables( Zyx_Man_t * p, word * pTruth )
{
    Vec_Wrd_t * vInfo = p->vInfo = Vec_WrdStart( p->nWords * (p->nObjs + 1) ); 
    int i, nMints = Abc_MaxInt( 64, 1 << p->pPars->nVars );
    assert( p->pPars->fMajority == (pTruth == NULL) );
    for ( i = 0; i < p->pPars->nVars; i++ )
        Abc_TtIthVar( Zyx_ManTruth(p, i), i, p->pPars->nVars );
    if ( p->pPars->fMajority )
    {
        for ( i = 0; i < nMints; i++ )
            if ( Zyx_ManValue(i, p->pPars->nVars) )
                Abc_TtSetBit( Zyx_ManTruth(p, p->nObjs), i );
        for ( i = 0; i < nMints; i++ )
            if ( Abc_TtBitCount16(i) == p->pPars->nVars/2 || Abc_TtBitCount16(i) == p->pPars->nVars/2+1 )
                Vec_IntPush( p->vMidMints, i );
    }
    //Dau_DsdPrintFromTruth( Zyx_ManTruth(p, p->nObjs), p->pPars->nVars );
    return vInfo;
}